

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromiseresolver.h
# Opt level: O0

void __thiscall
QtPromisePrivate::PromiseResolver<QString>::PromiseResolver
          (PromiseResolver<QString> *this,QPromise<QString> *promise)

{
  Data *pDVar1;
  QPromise<QString> *this_00;
  QPromise<QString> *promise_local;
  PromiseResolver<QString> *this_local;
  
  pDVar1 = (Data *)operator_new(0x10);
  QSharedData::QSharedData((QSharedData *)pDVar1);
  pDVar1->promise = (QPromise<QString> *)0x0;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QString>::Data>::
  QExplicitlySharedDataPointer(&this->m_d,pDVar1);
  this_00 = (QPromise<QString> *)operator_new(0x10);
  QtPromise::QPromise<QString>::QPromise(this_00,promise);
  pDVar1 = QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QString>::Data>::
           operator->(&this->m_d);
  pDVar1->promise = this_00;
  return;
}

Assistant:

PromiseResolver(QtPromise::QPromise<T> promise) : m_d{new Data{}}
    {
        m_d->promise = new QtPromise::QPromise<T>{std::move(promise)};
    }